

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_portability_unit.c
# Opt level: O1

int main(void)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  undefined **ppuVar8;
  CMUnitTest *pCVar9;
  byte bVar10;
  CMUnitTest tests [2];
  CMUnitTest aCStack_58 [2];
  
  bVar10 = 0;
  puVar1 = (uint *)cpuid_Version_info(1);
  uVar4 = (ulong)puVar1[3];
  uVar2 = *puVar1 >> 4;
  if (uVar2 < 0x406c) {
    if (uVar2 < 0x2065) {
      if (uVar2 < 0x266) {
        if (uVar2 < 0x6d) {
          uVar4 = (ulong)(uVar2 - 99);
          if (uVar2 - 99 < 2) {
            pcVar7 = "Prescott";
            goto LAB_00102a1e;
          }
          if (uVar2 == 0x66) {
            pcVar7 = "Presler";
            goto LAB_00102a1e;
          }
        }
        else {
          if (uVar2 == 0x6d) {
            pcVar7 = "Dothan";
            goto LAB_00102a1e;
          }
          if (uVar2 == 0x6f) goto switchD_001027cb_caseD_0;
          if (uVar2 == 0x16c) {
            pcVar7 = "Pineview";
            goto LAB_00102a1e;
          }
        }
      }
      else {
        uVar5 = (ulong)(uVar2 - 0x1066);
        if (uVar2 - 0x1066 < 9) {
          uVar4 = (long)&switchD_001027cb::switchdataD_00126004 +
                  (long)(int)(&switchD_001027cb::switchdataD_00126004)[uVar5];
          switch(uVar5) {
          case 0:
switchD_001027cb_caseD_0:
            pcVar7 = "Merom";
            goto LAB_00102a1e;
          case 1:
          case 7:
            pcVar7 = "Penryn";
            goto LAB_00102a1e;
          case 4:
          case 8:
switchD_001027cb_caseD_4:
            pcVar7 = "Nehalem";
            goto LAB_00102a1e;
          }
        }
        else {
          uVar4 = uVar5;
          if (uVar2 == 0x266) {
            pcVar7 = "Lincroft";
            goto LAB_00102a1e;
          }
          if (uVar2 == 0x366) {
            pcVar7 = "Cedarview";
            goto LAB_00102a1e;
          }
        }
      }
    }
    else if (uVar2 < 0x306a) {
      uVar2 = uVar2 - 0x2065;
      if (uVar2 < 0xb) {
        uVar4 = 0x481;
        if ((0x481U >> (uVar2 & 0x1f) & 1) != 0) {
          pcVar7 = "Westmere";
          goto LAB_00102a1e;
        }
        uVar4 = 0x120;
        if ((0x120U >> (uVar2 & 0x1f) & 1) != 0) {
          pcVar7 = "SandyBridge";
          goto LAB_00102a1e;
        }
        if (uVar2 == 9) goto switchD_001027cb_caseD_4;
      }
    }
    else if (uVar2 < 0x306d) {
      if (uVar2 == 0x306a) {
        pcVar7 = "IvyBridge";
        goto LAB_00102a1e;
      }
      if (uVar2 == 0x306c) {
        pcVar7 = "Haswell";
        goto LAB_00102a1e;
      }
    }
    else {
      if (uVar2 == 0x306d) {
        pcVar7 = "Broadwell";
        goto LAB_00102a1e;
      }
      if (uVar2 == 0x30f1) goto LAB_001029b1;
    }
  }
  else if (uVar2 < 0x9067) {
    if (uVar2 < 0x706a) {
      if (uVar2 < 0x606a) {
        if (uVar2 == 0x406c) {
          pcVar7 = "CherryTrail";
          goto LAB_00102a1e;
        }
        if (uVar2 == 0x506c) goto LAB_00102951;
        if (uVar2 == 0x506e) {
          pcVar7 = "Skylake";
          goto LAB_00102a1e;
        }
      }
      else {
        if (uVar2 == 0x606a) {
LAB_0010295d:
          pcVar7 = "Icelake";
          goto LAB_00102a1e;
        }
        if ((uVar2 == 0x60f0) || (uVar2 == 0x60f8)) {
LAB_001029b1:
          pcVar7 = "Zen2";
          goto LAB_00102a1e;
        }
      }
    }
    else if (uVar2 < 0x806c) {
      if (uVar2 == 0x706a) {
LAB_00102951:
        pcVar7 = "Goldmont";
        goto LAB_00102a1e;
      }
      if (uVar2 == 0x706e) goto LAB_0010295d;
      if (uVar2 == 0x70f1) goto LAB_001029b1;
    }
    else {
      uVar4 = (ulong)(uVar2 - 0x806c);
      if (uVar2 - 0x806c < 2) {
        pcVar7 = "TigerLake";
        goto LAB_00102a1e;
      }
      if (uVar2 == 0x806e) {
LAB_001029c1:
        pcVar7 = "Kabylake";
        goto LAB_00102a1e;
      }
    }
  }
  else if (uVar2 < 0xa067) {
    if (uVar2 < 0x90f0) {
      if ((uVar2 == 0x9067) || (uVar2 == 0x906a)) {
        pcVar7 = "Alderlake";
        goto LAB_00102a1e;
      }
      if (uVar2 == 0x906e) goto LAB_001029c1;
    }
    else {
      uVar4 = (ulong)(uVar2 - 0xa065);
      if (uVar2 - 0xa065 < 2) {
        pcVar7 = "Cometlake";
        goto LAB_00102a1e;
      }
      if (uVar2 == 0x90f0) goto LAB_001029b1;
    }
  }
  else if (uVar2 < 0x40f40) {
    if (uVar2 == 0xa067) {
      pcVar7 = "Rocketlake";
      goto LAB_00102a1e;
    }
    if (uVar2 == 0xb067) {
      pcVar7 = "Raptorlake";
      goto LAB_00102a1e;
    }
    if (uVar2 == 0x20f10) goto LAB_00102969;
  }
  else {
    if (uVar2 == 0x40f40) {
      pcVar7 = "Zen3+";
      goto LAB_00102a1e;
    }
    if (uVar2 == 0x50f00) {
LAB_00102969:
      pcVar7 = "Zen3";
      goto LAB_00102a1e;
    }
    if (uVar2 == 0x60f10) {
      pcVar7 = "Zen4";
      goto LAB_00102a1e;
    }
  }
  pcVar7 = "unknown";
LAB_00102a1e:
  printf("x64 processor:  %s\t",pcVar7,(ulong)puVar1[2],uVar4);
  printf(" compiler version: %s\t",
         "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
        );
  putchar(10);
  lVar6 = cpuid(0x80000006);
  if ((char)*(undefined4 *)(lVar6 + 0xc) != '@') {
    lVar6 = cpuid(0x80000006);
    printf("cache line: %d bytes\n",(ulong)(byte)*(uint *)(lVar6 + 0xc),(ulong)*(uint *)(lVar6 + 8),
           (ulong)*(uint *)(lVar6 + 0xc));
  }
  ppuVar8 = &PTR_anon_var_dwarf_27_00135d80;
  pCVar9 = aCStack_58;
  for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
    pCVar9->name = *ppuVar8;
    ppuVar8 = ppuVar8 + (ulong)bVar10 * -2 + 1;
    pCVar9 = (CMUnitTest *)((long)pCVar9 + ((ulong)bVar10 * -2 + 1) * 8);
  }
  iVar3 = _cmocka_run_group_tests
                    ("tests",aCStack_58,2,(CMFixtureFunction)0x0,(CMFixtureFunction)0x0);
  return iVar3;
}

Assistant:

int main() {
    tellmeall();
#if CROARING_IS_BIG_ENDIAN
    printf("Big-endian IO unsupported.\n");
    return EXIT_SUCCESS;
#else
    const struct CMUnitTest tests[] = {
        cmocka_unit_test(test_deserialize_portable_norun),
        cmocka_unit_test(test_deserialize_portable_wrun),
    };
    return cmocka_run_group_tests(tests, NULL, NULL);
#endif
}